

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.h
# Opt level: O0

strong_ordering QUuid::compareThreeWay_helper(QUuid *lhs,QUuid *rhs)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  uint i;
  strong_ordering c;
  uint in_stack_ffffffffffffffd8;
  unsigned_short rhs_00;
  unsigned_short in_stack_ffffffffffffffdc;
  uint uVar3;
  CompareUnderlyingType local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = (CompareUnderlyingType)
            Qt::compareThreeWay<unsigned_int,_unsigned_int,_true,_true>(in_stack_ffffffffffffffd8,0)
  ;
  rhs_00 = (unsigned_short)(in_stack_ffffffffffffffd8 >> 0x10);
  bVar2 = Qt::is_eq((strong_ordering)(CompareUnderlyingType)((ulong)in_RDI >> 0x38));
  if (bVar2) {
    local_9 = (CompareUnderlyingType)
              Qt::compareThreeWay<unsigned_short,_unsigned_short,_true,_true>
                        (in_stack_ffffffffffffffdc,rhs_00);
    bVar2 = Qt::is_eq((strong_ordering)(CompareUnderlyingType)((ulong)in_RDI >> 0x38));
    if (bVar2) {
      local_9 = (CompareUnderlyingType)
                Qt::compareThreeWay<unsigned_short,_unsigned_short,_true,_true>
                          (in_stack_ffffffffffffffdc,rhs_00);
      bVar2 = Qt::is_eq((strong_ordering)(CompareUnderlyingType)((ulong)in_RDI >> 0x38));
      if (bVar2) {
        for (uVar3 = 0; uVar3 < 8; uVar3 = uVar3 + 1) {
          local_9 = (CompareUnderlyingType)
                    Qt::compareThreeWay<unsigned_char,_unsigned_char,_true,_true>
                              ((uchar)(uVar3 >> 0x10),(uchar)(uVar3 >> 8));
          bVar2 = Qt::is_eq((strong_ordering)(CompareUnderlyingType)((ulong)in_RDI >> 0x38));
          if (!bVar2) goto LAB_00200bd3;
        }
        local_9 = '\0';
      }
    }
  }
LAB_00200bd3:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (strong_ordering)local_9;
}

Assistant:

static constexpr Qt::strong_ordering
    compareThreeWay_helper(const QUuid &lhs, const QUuid &rhs) noexcept
    {
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
        if (const auto c = Qt::compareThreeWay(lhs.data1, rhs.data1); !is_eq(c))
            return c;
        if (const auto c = Qt::compareThreeWay(lhs.data2, rhs.data2); !is_eq(c))
            return c;
        if (const auto c = Qt::compareThreeWay(lhs.data3, rhs.data3); !is_eq(c))
            return c;
#elif defined(__cpp_lib_bit_cast) && defined(QT_SUPPORTS_INT128)
        quint128 lu = qFromBigEndian(std::bit_cast<quint128>(lhs));
        quint128 ru = qFromBigEndian(std::bit_cast<quint128>(rhs));
        return Qt::compareThreeWay(lu, ru);
#else
        auto make_int = [](const QUuid &u) {
            quint64 result = quint64(u.data3) << 48;
            result |= quint64(u.data2) << 32;
            return qFromBigEndian(result | u.data1);
        };
        if (const auto c = Qt::compareThreeWay(make_int(lhs), make_int(rhs)); !is_eq(c))
            return c;
#endif
        for (unsigned i = 0; i < sizeof(lhs.data4); ++i) {
            if (const auto c = Qt::compareThreeWay(lhs.data4[i], rhs.data4[i]); !is_eq(c))
                return c;
        }
        return Qt::strong_ordering::equal;
    }